

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

word If_CluDeriveNonDisjoint(word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r)

{
  byte bVar1;
  int iVar2;
  int nVars_00;
  int iVar3;
  word wVar4;
  word wVar5;
  int nFSset1;
  int nFSset;
  int i;
  word Truth;
  word Truth1;
  word Truth0;
  word pCofs [2] [1024];
  If_Grp_t *r_local;
  If_Grp_t *g_local;
  int *P2V_local;
  int *V2P_local;
  int nVars_local;
  word *pF_local;
  
  iVar2 = nVars - g->nVars;
  nVars_00 = iVar2 + 1;
  pCofs[1][0x3ff] = (word)r;
  If_CluCofactors(pF,nVars,nVars + -1,&Truth0,pCofs[0] + 0x3ff);
  g->nVars = g->nVars + -1;
  wVar4 = If_CluDeriveDisjoint(&Truth0,nVars + -1,V2P,P2V,g,(If_Grp_t *)0x0);
  wVar5 = If_CluDeriveDisjoint(pCofs[0] + 0x3ff,nVars + -1,V2P,P2V,g,(If_Grp_t *)0x0);
  bVar1 = g->nVars;
  g->nVars = g->nVars + '\x01';
  if (nVars_00 < 6) {
    *pF = pCofs[0][0x3ff] << ((byte)(1 << ((byte)nVars_00 & 0x1f)) & 0x3f) | Truth0;
  }
  else {
    If_CluCopy(pF,&Truth0,nVars_00);
    iVar3 = If_CluWordNum(nVars_00);
    If_CluCopy(pF + iVar3,pCofs[0] + 0x3ff,nVars_00);
  }
  *(char *)pCofs[1][0x3ff] = (char)iVar2 + '\x02';
  *(undefined1 *)(pCofs[1][0x3ff] + 1) = 0;
  for (nFSset1 = 0; nFSset1 < iVar2; nFSset1 = nFSset1 + 1) {
    *(char *)(pCofs[1][0x3ff] + 2 + (long)nFSset1) = (char)P2V[nFSset1];
  }
  *(char *)(pCofs[1][0x3ff] + 2 + (long)iVar2) = (char)nVars;
  *(char *)(pCofs[1][0x3ff] + 2 + (long)(iVar2 + 1)) = g->pVars[g->nVars + -1];
  return wVar5 << ((byte)(1 << (bVar1 & 0x1f)) & 0x3f) | wVar4;
}

Assistant:

word If_CluDeriveNonDisjoint( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r )
{
    word pCofs[2][CLU_WRD_MAX];
    word Truth0, Truth1, Truth;
    int i, nFSset = nVars - g->nVars, nFSset1 = nFSset + 1;
    If_CluCofactors( pF, nVars, nVars - 1, pCofs[0], pCofs[1] );

//    Extra_PrintHex( stdout, (unsigned *)pCofs[0], nVars ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)pCofs[1], nVars ); printf( "\n" );

    g->nVars--;
    Truth0 = If_CluDeriveDisjoint( pCofs[0], nVars - 1, V2P, P2V, g, NULL );
    Truth1 = If_CluDeriveDisjoint( pCofs[1], nVars - 1, V2P, P2V, g, NULL );
    Truth  = (Truth1 << (1 << g->nVars)) | Truth0;
    g->nVars++;
    if ( nFSset1 < 6 )
        pF[0] = (pCofs[1][0] << (1 << nFSset1)) | pCofs[0][0];
    else
    {
        If_CluCopy( pF, pCofs[0], nFSset1 );
        If_CluCopy( pF + If_CluWordNum(nFSset1), pCofs[1], nFSset1 );
    }

//    Extra_PrintHex( stdout, (unsigned *)&Truth0, 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&Truth1, 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&pCofs[0][0], 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&pCofs[1][0], 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&Truth, 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&pF[0], 6 ); printf( "\n" );

    // create the resulting group
    r->nVars = nFSset + 2;
    r->nMyu = 0;
    for ( i = 0; i < nFSset; i++ )
        r->pVars[i] = P2V[i];
    r->pVars[nFSset] = nVars;
    r->pVars[nFSset+1] = g->pVars[g->nVars - 1];
    return Truth;
}